

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O0

string * __thiscall
libtorrent::base32encode_i2p_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,span<const_char> s)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  char *pcVar6;
  int *piVar7;
  iterator __result;
  byte *pbVar8;
  value_type_conflict3 *pvVar9;
  value_type_conflict2 *pvVar10;
  value_type *pvVar11;
  int local_60;
  int j;
  int num_out;
  int local_44;
  int local_40;
  int local_3c;
  int iStack_38;
  int available_input;
  char *i;
  array<std::uint8_t,_8> outbuf;
  array<std::uint8_t,_5> inbuf;
  span<const_char> s_local;
  string *ret;
  
  i._2_1_ = 0;
  unique0x10000463 = this;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  _iStack_38 = span<const_char>::begin
                         ((span<const_char> *)(outbuf.super_array<unsigned_char,_8UL>._M_elems + 5))
  ;
  while (pcVar6 = _iStack_38,
        pcVar4 = span<const_char>::end
                           ((span<const_char> *)
                            (outbuf.super_array<unsigned_char,_8UL>._M_elems + 5)), pcVar6 != pcVar4
        ) {
    sVar5 = ::std::array<unsigned_char,_5UL>::size((array<unsigned_char,_5UL> *)&outbuf);
    local_40 = (int)sVar5;
    pcVar6 = span<const_char>::end
                       ((span<const_char> *)(outbuf.super_array<unsigned_char,_8UL>._M_elems + 5));
    local_44 = (int)pcVar6 - iStack_38;
    piVar7 = ::std::min<int>(&local_40,&local_44);
    local_3c = *piVar7;
    j._3_1_ = 0;
    ::std::array<unsigned_char,_5UL>::fill
              ((array<unsigned_char,_5UL> *)&outbuf,(value_type_conflict3 *)((long)&j + 3));
    pcVar6 = _iStack_38;
    pcVar4 = _iStack_38 + local_3c;
    __result = ::std::array<unsigned_char,_5UL>::begin((array<unsigned_char,_5UL> *)&outbuf);
    ::std::copy<char_const*,unsigned_char*>(pcVar6,pcVar4,__result);
    _iStack_38 = _iStack_38 + local_3c;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,0);
    bVar1 = *pbVar8;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_> *)
                        ((long)&i + 3),0);
    *pbVar8 = bVar1 >> 3;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,0);
    bVar1 = *pbVar8;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,1);
    bVar2 = *pbVar8;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_> *)
                        ((long)&i + 3),1);
    *pbVar8 = (bVar1 & 7) << 2 | bVar2 >> 6;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,1);
    bVar1 = *pbVar8;
    pvVar9 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_> *)
                        ((long)&i + 3),2);
    *pvVar9 = (value_type_conflict3)((bVar1 & 0x3e) >> 1);
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,1);
    bVar1 = *pbVar8;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,2);
    bVar2 = *pbVar8;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_> *)
                        ((long)&i + 3),3);
    *pbVar8 = (bVar1 & 1) << 4 | bVar2 >> 4;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,2);
    bVar1 = *pbVar8;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,3);
    bVar2 = *pbVar8;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_> *)
                        ((long)&i + 3),4);
    *pbVar8 = (bVar1 & 0xf) * '\x02' | bVar2 >> 7;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,3);
    bVar1 = *pbVar8;
    pvVar9 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_> *)
                        ((long)&i + 3),5);
    *pvVar9 = (value_type_conflict3)((bVar1 & 0x7c) >> 2);
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,3);
    bVar1 = *pbVar8;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,4);
    bVar2 = *pbVar8;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_> *)
                        ((long)&i + 3),6);
    *pbVar8 = (bVar1 & 3) << 3 | bVar2 >> 5;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_5UL>_> *)
                        &outbuf,4);
    bVar1 = *pbVar8;
    pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_> *)
                        ((long)&i + 3),7);
    *pbVar8 = bVar1 & 0x1f;
    pvVar10 = aux::container_wrapper<int,_long,_std::array<int,_6UL>_>::operator[]
                        (&base32encode_i2p::input_output_mapping,(long)local_3c);
    iVar3 = *pvVar10;
    for (local_60 = 0; local_60 < iVar3; local_60 = local_60 + 1) {
      pbVar8 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_>::
               operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_8UL>_> *
                          )((long)&i + 3),(long)local_60);
      pvVar11 = aux::container_wrapper<char,_long,_std::array<char,_32UL>_>::operator[]
                          (&base32encode_i2p::base32_table,(ulong)*pbVar8);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar11);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base32encode_i2p(span<char const> s)
	{
		static aux::array<char, 32> const base32_table{
		{
			'a', 'b', 'c', 'd', 'e', 'f', 'g', 'h',
			'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p',
			'q', 'r', 's', 't', 'u', 'v', 'w', 'x',
			'y', 'z', '2', '3', '4', '5', '6', '7'
		}};

		static aux::array<int, 6> const input_output_mapping{{{0, 2, 4, 5, 7, 8}}};

		aux::array<std::uint8_t, 5> inbuf;
		aux::array<std::uint8_t, 8> outbuf;

		std::string ret;
		for (auto i = s.begin(); i != s.end();)
		{
			int const available_input = std::min(int(inbuf.size()), int(s.end() - i));

			// clear input buffer
			inbuf.fill(0);

			// read a chunk of input into inbuf
			std::copy(i, i + available_input, inbuf.begin());
			i += available_input;

			// encode inbuf to outbuf
			outbuf[0] = (inbuf[0] & 0xf8) >> 3;
			outbuf[1] = (((inbuf[0] & 0x07) << 2) | ((inbuf[1] & 0xc0) >> 6)) & 0xff;
			outbuf[2] = ((inbuf[1] & 0x3e) >> 1);
			outbuf[3] = (((inbuf[1] & 0x01) << 4) | ((inbuf[2] & 0xf0) >> 4)) & 0xff;
			outbuf[4] = (((inbuf[2] & 0x0f) << 1) | ((inbuf[3] & 0x80) >> 7)) & 0xff;
			outbuf[5] = ((inbuf[3] & 0x7c) >> 2);
			outbuf[6] = (((inbuf[3] & 0x03) << 3) | ((inbuf[4] & 0xe0) >> 5)) & 0xff;
			outbuf[7] = inbuf[4] & 0x1f;

			// write output
			int const num_out = input_output_mapping[available_input];
			for (int j = 0; j < num_out; ++j)
				ret += base32_table[outbuf[j]];
			// i2p does not use padding
		}
		return ret;
	}